

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationFactory.cpp
# Opt level: O2

bool __thiscall
OpenMD::OptimizationFactory::registerOptimization
          (OptimizationFactory *this,OptimizationCreator *creator)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>,_bool>
  pVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
  local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&creator->ident_);
  local_40.second = creator;
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>>
                      *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool OptimizationFactory::registerOptimization(OptimizationCreator* creator) {
    return creatorMap_
        .insert(CreatorMapType::value_type(creator->getIdent(), creator))
        .second;
  }